

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O1

void __thiscall
rlottie::Animation::setValue(uint param_1,Animation *this,Property param_3,string *param_4)

{
  ulong local_48 [2];
  code *local_38;
  undefined8 uStack_30;
  undefined1 local_28 [32];
  code *local_8;
  
  local_48[1] = 0;
  local_48[0] = (ulong)param_1;
  local_28._4_4_ = Value;
  local_8 = std::
            _Function_handler<float_(const_rlottie::FrameInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Samsung[P]rlottie/src/lottie/lottieanimation.cpp:395:34)>
            ::_M_invoke;
  local_28._8_8_ = local_48[0];
  local_28._16_8_ = 0;
  local_28._24_8_ =
       std::
       _Function_handler<float_(const_rlottie::FrameInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Samsung[P]rlottie/src/lottie/lottieanimation.cpp:395:34)>
       ::_M_manager;
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_28._0_4_ = param_3;
  if (param_4->_M_string_length != 0) {
    internal::renderer::Composition::setValue
              ((Composition *)
               (((this->d)._M_t.
                 super___uniq_ptr_impl<AnimationImpl,_std::default_delete<AnimationImpl>_>._M_t.
                 super__Tuple_impl<0UL,_AnimationImpl_*,_std::default_delete<AnimationImpl>_>.
                 super__Head_base<0UL,_AnimationImpl_*,_false>._M_head_impl)->mRenderer)._M_t,
               param_4,(LOTVariant *)local_28);
  }
  LOTVariant::Destroy((LOTVariant *)local_28);
  if (local_38 != (code *)0x0) {
    (*local_38)(local_48,local_48,3);
  }
  return;
}

Assistant:

void Animation::setValue(Float_Type, Property prop, const std::string &keypath,
                         float value)
{
    d->setValue(keypath,
                LOTVariant(prop, [value](const FrameInfo &) { return value; }));
}